

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Question * __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
          (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint *id)

{
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  Fault local_30;
  Fault f;
  DebugExpression<bool> _kjCondition;
  uint *id_local;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this_local;
  
  bVar1 = std::
          priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
          ::empty(&this->freeIds);
  if (bVar1) {
    sVar2 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::size(&this->slots);
    *id = (uint)sVar2;
    bVar1 = isHigh(this,id);
    f.exception._6_1_ = (bVar1 ^ 0xffU) & 1;
    f.exception._7_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)((long)&f.exception + 7));
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
                (&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xfb,FAILED,"!isHigh(id)","_kjCondition,\"2^31 concurrent questions?!!?!\"",
                 (DebugExpression<bool> *)((long)&f.exception + 7),
                 (char (*) [31])"2^31 concurrent questions?!!?!");
      kj::_::Debug::Fault::fatal(&local_30);
    }
    this_local = (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *
                 )kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::add<>
                            (&this->slots);
  }
  else {
    pvVar3 = std::
             priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
             ::top(&this->freeIds);
    *id = *pvVar3;
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::pop(&this->freeIds);
    this_local = (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *
                 )kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::operator[]
                            (&this->slots,(ulong)*id);
  }
  return (Question *)this_local;
}

Assistant:

T& next(Id& id) {
    if (freeIds.empty()) {
      id = slots.size();
      KJ_ASSERT(!isHigh(id), "2^31 concurrent questions?!!?!");
      return slots.add();
    } else {
      id = freeIds.top();
      freeIds.pop();
      return slots[id];
    }
  }